

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrenum.cpp
# Opt level: O2

UEnumeration * uenum_openUCharStringsEnumeration_63(UChar **strings,int32_t count,UErrorCode *ec)

{
  UEnumeration *pUVar1;
  
  if (((-1 < count) && (*ec < U_ILLEGAL_ARGUMENT_ERROR)) && (strings != (UChar **)0x0 || count == 0)
     ) {
    pUVar1 = (UEnumeration *)uprv_malloc_63(0x40);
    if (pUVar1 != (UEnumeration *)0x0) {
      pUVar1->baseContext = (void *)0x0;
      pUVar1->context = (void *)0x0;
      pUVar1->reset = ucharstrenum_reset;
      pUVar1->uNext = ucharstrenum_unext;
      pUVar1->next = uenum_nextDefault_63;
      pUVar1->close = ucharstrenum_close;
      pUVar1->count = ucharstrenum_count;
      pUVar1->context = strings;
      *(undefined4 *)&pUVar1[1].baseContext = 0;
      *(int32_t *)((long)&pUVar1[1].baseContext + 4) = count;
      return pUVar1;
    }
    *ec = U_MEMORY_ALLOCATION_ERROR;
  }
  return (UEnumeration *)0x0;
}

Assistant:

U_CAPI UEnumeration* U_EXPORT2
uenum_openUCharStringsEnumeration(const UChar* const strings[], int32_t count,
                                 UErrorCode* ec) {
    UCharStringEnumeration* result = NULL;
    if (U_SUCCESS(*ec) && count >= 0 && (count == 0 || strings != 0)) {
        result = (UCharStringEnumeration*) uprv_malloc(sizeof(UCharStringEnumeration));
        if (result == NULL) {
            *ec = U_MEMORY_ALLOCATION_ERROR;
        } else {
            U_ASSERT((char*)result==(char*)(&result->uenum));
            uprv_memcpy(result, &UCHARSTRENUM_U_VT, sizeof(UCHARSTRENUM_U_VT));
            result->uenum.context = (void*)strings;
            result->index = 0;
            result->count = count;
        }
    }
    return (UEnumeration*) result;
}